

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkProfileCones(Wlc_Ntk_t *p)

{
  uint uVar1;
  uint i;
  int nMults;
  int nAdders;
  int nFos;
  int nPis;
  
  for (i = 0; (int)i < (p->vCos).nSize; i = i + 1) {
    Wlc_NtkCo(p,i);
    Wlc_NtkMarkCone(p,i,1,0,0);
    uVar1 = Wlc_NtkCountMarked(p,&nPis,&nFos,&nAdders,&nMults);
    printf("Cone %5d : ",(ulong)i);
    printf("PI = %4d  ",(ulong)(uint)nPis);
    printf("FO = %4d  ",(ulong)(uint)nFos);
    printf("Node = %6d  ",(ulong)uVar1);
    printf("Add/Sub = %4d  ",(ulong)(uint)nAdders);
    printf("Mult = %4d  ",(ulong)(uint)nMults);
    putchar(10);
  }
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkProfileCones( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, nPis, nFos, nNodes, nAdders, nMults;
    Wlc_NtkForEachCo( p, pObj, i )
    {
        Wlc_NtkMarkCone( p, i, 1, 0, 0 );
        nNodes = Wlc_NtkCountMarked( p, &nPis, &nFos, &nAdders, &nMults );
        printf( "Cone %5d : ", i );
        printf( "PI = %4d  ", nPis );
        printf( "FO = %4d  ", nFos );
        printf( "Node = %6d  ", nNodes );
        printf( "Add/Sub = %4d  ", nAdders );
        printf( "Mult = %4d  ", nMults );
        printf( "\n" );
    }
    Wlc_NtkCleanMarks( p );
}